

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::error(Spi *this,int status)

{
  ostream *this_00;
  int status_local;
  Spi *this_local;
  
  check_rx(this);
  this_00 = std::operator<<((ostream *)&std::cerr,"ABORT.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if ((this->active & 1U) != 0) {
    disconnect(this);
  }
  exit(status);
}

Assistant:

void Spi::error(int status) {
	check_rx();
	cerr << "ABORT." << endl;
	if (active)
		disconnect();
	exit(status);
}